

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseTagTypeSpecifier_AtFirst<psy::C::EnumDeclarationSyntax>
          (Parser *this,DeclarationSyntax **decl,SpecifierSyntax **spec,SyntaxKind declK,
          SyntaxKind specK,offset_in_Parser_to_subr parseMember)

{
  char cVar1;
  SyntaxToken *pSVar2;
  TagTypeSpecifierSyntax *pTVar3;
  IndexType IVar4;
  ostream *poVar5;
  code *pcVar6;
  SyntaxNodePlainList<psy::C::DeclarationSyntax_*> *pSVar7;
  SyntaxNodePlainList<psy::C::DeclarationSyntax_*> **ppSVar8;
  long *plVar9;
  code *in_stack_00000008;
  long in_stack_00000010;
  SyntaxKind specK_local;
  SyntaxKind declK_local;
  TagTypeSpecifierSyntax *tySpec;
  DeclarationSyntax **local_60;
  DeclarationSyntax *membDecl;
  anon_class_32_4_06b38f02 wrapTySpecInTyDecl;
  
  specK_local = specK;
  declK_local = declK;
  local_60 = decl;
  pSVar2 = peek(this,1);
  if ((pSVar2->syntaxK_ == Keyword_struct) ||
     (pSVar2 = peek(this,1), pSVar2->syntaxK_ == Keyword_union)) {
    if (2 < (ushort)(declK - StructDeclaration)) goto LAB_002eb80a;
  }
  else {
    pSVar2 = peek(this,1);
    if (pSVar2->syntaxK_ != Keyword_enum || 2 < (ushort)(declK - StructDeclaration))
    goto LAB_002eb80a;
  }
  if ((ushort)(specK - StructTypeSpecifier) < 3) {
    pTVar3 = makeNode<psy::C::TagTypeSpecifierSyntax,psy::C::SyntaxKind&>(this,&specK_local);
    *spec = &pTVar3->super_SpecifierSyntax;
    tySpec = pTVar3;
    IVar4 = consume(this);
    pTVar3->kwTkIdx_ = IVar4;
    pSVar2 = peek(this,1);
    if (pSVar2->syntaxK_ == KeywordAlias___attribute) {
      parseExtGNU_AttributeSpecifierList_AtFirst(this,&pTVar3->attrs1_);
    }
    wrapTySpecInTyDecl.declK = &declK_local;
    wrapTySpecInTyDecl.decl = local_60;
    wrapTySpecInTyDecl.tySpec = &tySpec;
    wrapTySpecInTyDecl.this = this;
    pSVar2 = peek(this,1);
    if (pSVar2->syntaxK_ != OpenBraceToken) {
      if (pSVar2->syntaxK_ != IdentifierToken) {
        DiagnosticsReporter::ExpectedFollowOfStructOrUnionOrEnum(&this->diagReporter_);
        return false;
      }
      IVar4 = consume(this);
      tySpec->tagTkIdx_ = IVar4;
      pSVar2 = peek(this,1);
      if (pSVar2->syntaxK_ != OpenBraceToken) {
        if (pSVar2->syntaxK_ != SemicolonToken) {
          return true;
        }
        if ((ushort)(specK_local - StructTypeSpecifier) < 2) {
          parseTagTypeSpecifier_AtFirst<psy::C::EnumDeclarationSyntax>::anon_class_32_4_06b38f02::
          operator()(&wrapTySpecInTyDecl);
          return true;
        }
        return true;
      }
    }
    IVar4 = consume(this);
    tySpec->openBraceTkIdx_ = IVar4;
    parseTagTypeSpecifier_AtFirst<psy::C::EnumDeclarationSyntax>::anon_class_32_4_06b38f02::
    operator()(&wrapTySpecInTyDecl);
    ppSVar8 = &tySpec->decls_;
    plVar9 = (long *)((long)&this->pool_ + in_stack_00000010);
    do {
      membDecl = (DeclarationSyntax *)0x0;
      pSVar2 = peek(this,1);
      if (pSVar2->syntaxK_ == CloseBraceToken) {
        IVar4 = consume(this);
        tySpec->closeBraceTkIdx_ = IVar4;
        pSVar2 = peek(this,1);
        if (pSVar2->syntaxK_ == KeywordAlias___attribute) {
          parseExtGNU_AttributeSpecifierList_AtFirst(this,&tySpec->attrs2_);
          return true;
        }
        return true;
      }
      pcVar6 = in_stack_00000008;
      if (((ulong)in_stack_00000008 & 1) != 0) {
        pcVar6 = *(code **)(in_stack_00000008 + *plVar9 + -1);
      }
      cVar1 = (*pcVar6)(plVar9,&membDecl);
      if (cVar1 == '\0') {
        ignoreMemberDeclaration(this);
        pSVar2 = peek(this,1);
        if (pSVar2->syntaxK_ == EndOfFile) {
          return false;
        }
      }
      pSVar7 = makeNode<psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax*>,psy::C::DeclarationSyntax*&>
                         (this,&membDecl);
      *ppSVar8 = pSVar7;
      ppSVar8 = &(pSVar7->
                 super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                 ).
                 super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                 .next;
    } while( true );
  }
LAB_002eb80a:
  poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x600);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,"assert failure: `struct\', `union\', or `enum\'");
  std::endl<char,std::char_traits<char>>(poVar5);
  return false;
}

Assistant:

bool Parser::parseTagTypeSpecifier_AtFirst(
        DeclarationSyntax*& decl,
        SpecifierSyntax*& spec,
        SyntaxKind declK,
        SyntaxKind specK,
        bool (Parser::*parseMember)(DeclarationSyntax*&))
{
    DBG_THIS_RULE();
    PSY_ASSERT_3((peek().kind() == SyntaxKind::Keyword_struct
                        || peek().kind() == SyntaxKind::Keyword_union
                        || peek().kind() == SyntaxKind::Keyword_enum)
                    && (declK == SyntaxKind::StructDeclaration
                        || declK == SyntaxKind::UnionDeclaration
                        || declK == SyntaxKind::EnumDeclaration)
                    && (specK == SyntaxKind::StructTypeSpecifier
                        || specK == SyntaxKind::UnionTypeSpecifier
                        || specK == SyntaxKind::EnumTypeSpecifier),
                  return false,
                  "assert failure: `struct', `union', or `enum'");

    auto tySpec = makeNode<TagTypeSpecifierSyntax>(specK);
    spec = tySpec;
    tySpec->kwTkIdx_ = consume();

    if (peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__)
        parseExtGNU_AttributeSpecifierList_AtFirst(tySpec->attrs1_);

    auto wrapTySpecInTyDecl = [&]() {
        auto tyDecl = makeNode<TypeDeclT>(declK);
        decl = tyDecl;
        tyDecl->typeSpec_ = tySpec;
    };

    switch (peek().kind()) {
        case SyntaxKind::OpenBraceToken:
            tySpec->openBraceTkIdx_ = consume();
            break;

        case SyntaxKind::IdentifierToken:
            tySpec->tagTkIdx_ = consume();
            switch (peek().kind()) {
                case SyntaxKind::OpenBraceToken:
                    tySpec->openBraceTkIdx_ = consume();
                    break;

                case SyntaxKind::SemicolonToken:
                    if (specK == SyntaxKind::StructTypeSpecifier
                            || specK == SyntaxKind::UnionTypeSpecifier) {
                        wrapTySpecInTyDecl();
                        return true;
                    }
                    [[fallthrough]];

                default:
                    return true;
            }
            break;

        default:
            diagReporter_.ExpectedFollowOfStructOrUnionOrEnum();
            return false;
    }

    wrapTySpecInTyDecl();

    DeclarationListSyntax** declList_cur = &tySpec->decls_;

    while (true) {
        DeclarationSyntax* membDecl = nullptr;
        switch (peek().kind()) {
            case SyntaxKind::CloseBraceToken:
                tySpec->closeBraceTkIdx_ = consume();
                goto MembersParsed;

            default:
                if (!((this)->*(parseMember))(membDecl)) {
                    ignoreMemberDeclaration();
                    if (peek().kind() == SyntaxKind::EndOfFile)
                        return false;
                }
                break;
        }
        *declList_cur = makeNode<DeclarationListSyntax>(membDecl);
        declList_cur = &(*declList_cur)->next;
    }

MembersParsed:
    if (peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__)
        parseExtGNU_AttributeSpecifierList_AtFirst(tySpec->attrs2_);

    return true;
}